

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_draw_list_init(nk_draw_list *list)

{
  nk_vec2 *pnVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  nk_draw_list *__s;
  size_t __n;
  size_t __n_00;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  nk_vec2 nVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  
  if (list != (nk_draw_list *)0x0) {
    __n = (ulong)list & 3;
    if (__n == 0) {
      __n = 0xf0;
      __s = list;
    }
    else {
      __n_00 = -__n + 4;
      memset(list,0,__n_00);
      memset((void *)((long)list + __n_00),0,0xec);
      __s = (nk_draw_list *)((long)list + -__n + 0xf0);
    }
    memset(__s,0,__n);
    lVar4 = 2;
    auVar12 = _DAT_0015f0d0;
    auVar7 = _DAT_0015f0b0;
    do {
      uVar5 = auVar7._0_8_;
      if ((long)uVar5 < 0) {
        fVar9 = (float)((ulong)(auVar7._0_4_ & 1) | uVar5 >> 1);
        fVar9 = fVar9 + fVar9;
      }
      else {
        fVar9 = (float)(long)uVar5;
      }
      uVar2 = auVar7._8_8_;
      if (auVar7._12_4_ < 0) {
        fVar14 = (float)((ulong)(auVar7._8_4_ & 1) | uVar2 >> 1);
        fVar14 = fVar14 + fVar14;
      }
      else {
        fVar14 = (float)(long)uVar2;
      }
      uVar6 = auVar12._0_8_;
      if ((long)uVar6 < 0) {
        fVar8 = (float)((ulong)(auVar12._0_4_ & 1) | uVar6 >> 1);
        fVar8 = fVar8 + fVar8;
      }
      else {
        fVar8 = (float)(long)uVar6;
      }
      auVar11._4_4_ = fVar14;
      auVar11._0_4_ = fVar9;
      uVar3 = auVar12._8_8_;
      if (auVar12._12_4_ < 0) {
        fVar9 = (float)((ulong)(auVar12._8_4_ & 1) | uVar3 >> 1);
        fVar9 = fVar9 + fVar9;
      }
      else {
        fVar9 = (float)(long)uVar3;
      }
      auVar11._12_4_ = fVar9;
      auVar11._8_4_ = fVar8;
      auVar12 = divps(auVar11,_DAT_0015f0e0);
      fVar9 = (auVar12._0_4_ + auVar12._0_4_) * 3.1415927;
      fVar14 = (auVar12._4_4_ + auVar12._4_4_) * 3.1415927;
      fVar8 = (auVar12._8_4_ + auVar12._8_4_) * 3.1415927;
      fVar13 = (auVar12._12_4_ + auVar12._12_4_) * 3.1415927;
      nVar10.y = ((((((fVar9 * 0.00013823564 + -0.0030399605) * fVar9 + 0.02080266) * fVar9 +
                    -0.02673534) * fVar9 + -0.13807878) * fVar9 + -0.012127613) * fVar9 + 1.0008676)
                 * fVar9 + 1.910593e-31;
      nVar10.x = ((((((fVar9 * -5.2302214e-14 + 0.000990141) * fVar9 + -0.018663716) * fVar9 +
                    0.1071238) * fVar9 + -0.11813404) * fVar9 + -0.39438233) * fVar9 + -0.038191997)
                 * fVar9 + 1.002386;
      pnVar1 = list->circle_vtx + lVar4;
      pnVar1->x = ((((((fVar8 * -5.2302214e-14 + 0.000990141) * fVar8 + -0.018663716) * fVar8 +
                     0.1071238) * fVar8 + -0.11813404) * fVar8 + -0.39438233) * fVar8 + -0.038191997
                  ) * fVar8 + 1.002386;
      pnVar1->y = ((((((fVar8 * 0.00013823564 + -0.0030399605) * fVar8 + 0.02080266) * fVar8 +
                     -0.02673534) * fVar8 + -0.13807878) * fVar8 + -0.012127613) * fVar8 + 1.0008676
                  ) * fVar8 + 1.910593e-31;
      pnVar1[1].x = ((((((fVar13 * -5.2302214e-14 + 0.000990141) * fVar13 + -0.018663716) * fVar13 +
                       0.1071238) * fVar13 + -0.11813404) * fVar13 + -0.39438233) * fVar13 +
                    -0.038191997) * fVar13 + 1.002386;
      pnVar1[1].y = ((((((fVar13 * 0.00013823564 + -0.0030399605) * fVar13 + 0.02080266) * fVar13 +
                       -0.02673534) * fVar13 + -0.13807878) * fVar13 + -0.012127613) * fVar13 +
                    1.0008676) * fVar13 + 1.910593e-31;
      pnVar1 = list->circle_vtx + lVar4 + -2;
      *pnVar1 = nVar10;
      pnVar1[2].x = ((((((fVar14 * -5.2302214e-14 + 0.000990141) * fVar14 + -0.018663716) * fVar14 +
                       0.1071238) * fVar14 + -0.11813404) * fVar14 + -0.39438233) * fVar14 +
                    -0.038191997) * fVar14 + 1.002386;
      pnVar1[2].y = ((((((fVar14 * 0.00013823564 + -0.0030399605) * fVar14 + 0.02080266) * fVar14 +
                       -0.02673534) * fVar14 + -0.13807878) * fVar14 + -0.012127613) * fVar14 +
                    1.0008676) * fVar14 + 1.910593e-31;
      auVar7._0_8_ = uVar5 + 4;
      auVar7._8_8_ = uVar2 + 4;
      auVar12._0_8_ = uVar6 + 4;
      auVar12._8_8_ = uVar3 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0xe);
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x23b1,"void nk_draw_list_init(struct nk_draw_list *)");
}

Assistant:

NK_API void
nk_draw_list_init(struct nk_draw_list *list)
{
    nk_size i = 0;
    NK_ASSERT(list);
    if (!list) return;
    nk_zero(list, sizeof(*list));
    for (i = 0; i < NK_LEN(list->circle_vtx); ++i) {
        const float a = ((float)i / (float)NK_LEN(list->circle_vtx)) * 2 * NK_PI;
        list->circle_vtx[i].x = (float)NK_COS(a);
        list->circle_vtx[i].y = (float)NK_SIN(a);
    }
}